

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  FILE *f;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  string file;
  string outdir;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  RCO rco;
  
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&outdir,".",(allocator *)&rco);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < argc) {
    uVar4 = (ulong)(uint)argc;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    __s = argv[uVar3];
    if ((((__s != (char *)0x0) && (sVar1 = strlen(__s), 2 < (int)sVar1)) && (*__s == '-')) &&
       ((psVar2 = &file, __s[1] == 'f' || (psVar2 = &outdir, __s[2] == 'd')))) {
      std::__cxx11::string::assign((char *)psVar2);
    }
  }
  iVar5 = 1;
  if (((file._M_string_length != 0) ||
      ((1 < argc && (std::__cxx11::string::assign((char *)&file), file._M_string_length != 0)))) &&
     (f = fopen(file._M_dataplus._M_p,"rb"), f != (FILE *)0x0)) {
    RCO::RCO(&rco,(FILE *)f);
    if (file._M_dataplus._M_p[1] == ':') {
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&file);
      this = &local_1d0;
      std::__cxx11::string::operator=((string *)&outdir,(string *)this);
    }
    else {
      std::operator+(&local_1f0,&outdir,"/");
      std::__cxx11::string::substr((ulong)&local_210,(ulong)&file);
      std::operator+(&local_1d0,&local_1f0,&local_210);
      std::__cxx11::string::operator=((string *)&outdir,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_210);
      this = &local_1f0;
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::string((string *)&local_230,(string *)&outdir);
    RCO::dump(&rco,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    RCO::~RCO(&rco);
    iVar5 = 0;
  }
  std::__cxx11::string::~string((string *)&outdir);
  std::__cxx11::string::~string((string *)&file);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *f;
	std::string file;
	std::string outdir = ".";

	// Loop over arguments and handle accordingly.
	// -fINPUT_FILE
	// -dOUTPUT_DIR
	for (int i = 0; i < argc; i++)
	{
		if (argv[i] != nullptr)
		{
			int arglen = strlen(argv[i]);
			if (arglen > 2)
			{
				if (argv[i][0] == '-' && argv[i][1] == 'f')
				{
					file = &argv[i][2];
				}
				else if (argv[i][0] == '-' && argv[i][2] == 'd')
				{
					outdir = &argv[i][2];
				}
			}
		}
	}

	// If no -f or -d, attempt to parse any >1 args as input files, 
	// allows to keep supporting drag&drop on windows
	if (file.empty())
	{
		if (argc > 1)
			file = argv[1];
		
		if (file.empty())
			return 1;	
	}

	f = fopen(file.c_str(), "rb");
	if (!f)
		return 1;

	// Got an absolute file
	RCO rco(f);
	
	if (file[1] == ':')
		outdir = file.substr(0, file.length() - 4);
	else
		outdir = outdir + "/" + file.substr(0, file.length() - 4);
	rco.dump(outdir);

    return 0;
}